

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
          (ValueMap<std::vector<double,_std::allocator<double>_>,_int> *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_> this_00;
  pointer ppVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
  pVar4;
  int *in_stack_ffffffffffffff28;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *pvVar5;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffff40;
  size_type *in_stack_ffffffffffffff48;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_98;
  _Base_ptr local_78;
  undefined1 local_70;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_58;
  _Base_ptr local_18;
  undefined1 local_10;
  
  bVar1 = std::
          map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
          ::empty((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   *)0x17f895);
  if (bVar1) {
    in_stack_ffffffffffffff48 = &in_RDI[1]._M_string_length;
    local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
    in_stack_ffffffffffffff50 = &local_58;
    CreateArray<std::vector<double,std::allocator<double>>,int>(in_stack_ffffffffffffff3c);
    std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::
    pair<int,_std::vector<double,_std::allocator<double>_>,_true>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (vector<double,_std::allocator<double>_> *)0x17f8e8);
    pVar4 = std::
            map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::insert(in_stack_ffffffffffffff40,
                     (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    this_00 = pVar4.first._M_node;
    local_70 = pVar4.second;
    local_78 = this_00._M_node;
    local_18 = this_00._M_node;
    local_10 = local_70;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>
                           *)0x17f93e);
    pvVar5 = &ppVar2->second;
    std::operator+(in_RDI,(char *)in_stack_ffffffffffffff50);
    SetValueNodeName<std::vector<double,std::allocator<double>>>(pvVar5,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>::~pair
              ((pair<const_int,_std::vector<double,_std::allocator<double>_>_> *)0x17f98b);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this_00._M_node);
  }
  pmVar3 = std::
           map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::at(in_stack_ffffffffffffff50,(key_type_conflict *)in_stack_ffffffffffffff48);
  return pmVar3;
}

Assistant:

Array& operator()() & {
    if (map_.empty())
      SetValueNodeName(
            map_.insert({ 0,
                           CreateArray<Array, Param>(prm_) }).
            first->second,
            name_ + "()");
    else
      assert(IsSingleKey());
    return map_.at(0);
  }